

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::ConductorBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,ConductorBxDF *this)

{
  SampledSpectrum *in_R9;
  
  StringPrintf<pbrt::TrowbridgeReitzDistribution_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,(pbrt *)"[ ConductorBxDF mfDistrib: %s eta: %s k: %s ]",
             (char *)this,(TrowbridgeReitzDistribution *)&this->eta,&this->k,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string ConductorBxDF::ToString() const {
    return StringPrintf("[ ConductorBxDF mfDistrib: %s eta: %s k: %s ]", mfDistrib, eta,
                        k);
}